

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::MapCallSiteToCallApplyCallSiteMap(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  anon_class_8_1_13edd398_for_fn fn;
  ProfileId *pPVar1;
  FunctionBody *functionBody;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *this_local;
  
  fn.functionBody = FuncInfo::GetParsedFunctionBody(funcInfo);
  pPVar1 = Js::FunctionBody::CreateCallSiteToCallApplyCallSiteArray(fn.functionBody);
  if (pPVar1 != (ProfileId *)0x0) {
    JsUtil::
    BaseDictionary<unsigned_short,unsigned_short,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::Map<ByteCodeGenerator::MapCallSiteToCallApplyCallSiteMap(FuncInfo*)::__0>
              ((BaseDictionary<unsigned_short,unsigned_short,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)funcInfo->callSiteToCallApplyCallSiteMap,fn);
  }
  return;
}

Assistant:

void ByteCodeGenerator::MapCallSiteToCallApplyCallSiteMap(FuncInfo * funcInfo)
{
    Js::FunctionBody * functionBody = funcInfo->GetParsedFunctionBody();
    
    if (functionBody->CreateCallSiteToCallApplyCallSiteArray())
    {
        funcInfo->callSiteToCallApplyCallSiteMap->Map([functionBody](Js::ProfileId callSiteId, Js::ProfileId callApplyCallSiteId)
        {
            functionBody->GetCallSiteToCallApplyCallSiteArray()[callSiteId] = callApplyCallSiteId;
        });
    }
}